

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 (*pauVar41) [16];
  int iVar42;
  undefined1 (*pauVar43) [16];
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar47;
  ulong uVar48;
  Geometry *pGVar49;
  GridSOA *pGVar50;
  ulong uVar51;
  GridSOA *pGVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar67 [32];
  undefined1 auVar66 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [16];
  float fVar106;
  undefined1 auVar100 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined4 uVar115;
  undefined4 uVar116;
  undefined4 uVar117;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 uStack_14d8;
  GridSOA *local_14b8;
  ulong local_14b0;
  ulong local_14a8;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [16];
  undefined1 auStack_1470 [16];
  ulong local_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  RTCFilterFunctionNArguments local_1410;
  Geometry *local_13e0;
  undefined1 auStack_13d8 [24];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [16];
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  GridSOA **local_1300;
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined4 local_10c0;
  undefined4 uStack_10bc;
  undefined4 uStack_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined4 local_10a0;
  undefined4 uStack_109c;
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1088;
  undefined4 uStack_1084;
  undefined4 local_1080;
  undefined4 uStack_107c;
  undefined4 uStack_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 uStack_1068;
  undefined4 uStack_1064;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar101 [32];
  
  pauVar43 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar115 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar118._4_4_ = uVar115;
  auVar118._0_4_ = uVar115;
  auVar118._8_4_ = uVar115;
  auVar118._12_4_ = uVar115;
  uVar115 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar119._4_4_ = uVar115;
  auVar119._0_4_ = uVar115;
  auVar119._8_4_ = uVar115;
  auVar119._12_4_ = uVar115;
  uVar115 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar120._4_4_ = uVar115;
  auVar120._0_4_ = uVar115;
  auVar120._8_4_ = uVar115;
  auVar120._12_4_ = uVar115;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar21 = fVar1 * 0.99999964;
  fVar22 = fVar2 * 0.99999964;
  fVar23 = fVar3 * 0.99999964;
  fVar1 = fVar1 * 1.0000004;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1448 = uVar53 ^ 0x10;
  iVar42 = (tray->tnear).field_0.i[k];
  auVar99._4_4_ = iVar42;
  auVar99._0_4_ = iVar42;
  auVar99._8_4_ = iVar42;
  auVar99._12_4_ = iVar42;
  iVar42 = (tray->tfar).field_0.i[k];
  auVar64 = ZEXT1664(CONCAT412(iVar42,CONCAT48(iVar42,CONCAT44(iVar42,iVar42))));
  iVar42 = 1 << ((uint)k & 0x1f);
  auVar67._4_4_ = iVar42;
  auVar67._0_4_ = iVar42;
  auVar67._8_4_ = iVar42;
  auVar67._12_4_ = iVar42;
  auVar67._16_4_ = iVar42;
  auVar67._20_4_ = iVar42;
  auVar67._24_4_ = iVar42;
  auVar67._28_4_ = iVar42;
  auVar56 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar67 = vpand_avx2(auVar67,auVar56);
  local_1200 = vpcmpeqd_avx2(auVar67,auVar56);
LAB_0058d8be:
  do {
    pauVar41 = pauVar43 + -1;
    pauVar43 = pauVar43 + -1;
    if (*(float *)(*pauVar41 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar48 = *(ulong *)*pauVar43;
      while ((uVar48 & 8) == 0) {
        auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar53),auVar118);
        auVar65._0_4_ = fVar21 * auVar66._0_4_;
        auVar65._4_4_ = fVar21 * auVar66._4_4_;
        auVar65._8_4_ = fVar21 * auVar66._8_4_;
        auVar65._12_4_ = fVar21 * auVar66._12_4_;
        auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar55),auVar119);
        auVar73._0_4_ = fVar22 * auVar66._0_4_;
        auVar73._4_4_ = fVar22 * auVar66._4_4_;
        auVar73._8_4_ = fVar22 * auVar66._8_4_;
        auVar73._12_4_ = fVar22 * auVar66._12_4_;
        auVar66 = vmaxps_avx(auVar65,auVar73);
        auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + uVar54),auVar120);
        auVar74._0_4_ = fVar23 * auVar65._0_4_;
        auVar74._4_4_ = fVar23 * auVar65._4_4_;
        auVar74._8_4_ = fVar23 * auVar65._8_4_;
        auVar74._12_4_ = fVar23 * auVar65._12_4_;
        auVar65 = vmaxps_avx(auVar74,auVar99);
        local_1360 = vmaxps_avx(auVar66,auVar65);
        auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + local_1448),auVar118);
        auVar75._0_4_ = fVar1 * auVar66._0_4_;
        auVar75._4_4_ = fVar1 * auVar66._4_4_;
        auVar75._8_4_ = fVar1 * auVar66._8_4_;
        auVar75._12_4_ = fVar1 * auVar66._12_4_;
        auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar55 ^ 0x10)),auVar119);
        auVar79._0_4_ = fVar2 * auVar66._0_4_;
        auVar79._4_4_ = fVar2 * auVar66._4_4_;
        auVar79._8_4_ = fVar2 * auVar66._8_4_;
        auVar79._12_4_ = fVar2 * auVar66._12_4_;
        auVar66 = vminps_avx(auVar75,auVar79);
        auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar48 + 0x20 + (uVar54 ^ 0x10)),auVar120);
        auVar80._0_4_ = fVar3 * auVar65._0_4_;
        auVar80._4_4_ = fVar3 * auVar65._4_4_;
        auVar80._8_4_ = fVar3 * auVar65._8_4_;
        auVar80._12_4_ = fVar3 * auVar65._12_4_;
        auVar65 = vminps_avx(auVar80,auVar64._0_16_);
        auVar66 = vminps_avx(auVar66,auVar65);
        auVar66 = vcmpps_avx(local_1360,auVar66,2);
        uVar45 = vmovmskps_avx(auVar66);
        if (uVar45 == 0) {
          if (pauVar43 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0058d8be;
        }
        uVar45 = uVar45 & 0xff;
        uVar44 = uVar48 & 0xfffffffffffffff0;
        lVar25 = 0;
        for (uVar48 = (ulong)uVar45; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar48 = *(ulong *)(uVar44 + lVar25 * 8);
        uVar45 = uVar45 - 1 & uVar45;
        uVar47 = (ulong)uVar45;
        if (uVar45 != 0) {
          uVar5 = *(uint *)(local_1360 + lVar25 * 4);
          lVar25 = 0;
          for (; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar45 = uVar45 - 1 & uVar45;
          uVar51 = (ulong)uVar45;
          uVar47 = *(ulong *)(uVar44 + lVar25 * 8);
          uVar46 = *(uint *)(local_1360 + lVar25 * 4);
          if (uVar45 == 0) {
            if (uVar5 < uVar46) {
              *(ulong *)*pauVar43 = uVar47;
              *(uint *)(*pauVar43 + 8) = uVar46;
              pauVar43 = pauVar43 + 1;
            }
            else {
              *(ulong *)*pauVar43 = uVar48;
              *(uint *)(*pauVar43 + 8) = uVar5;
              pauVar43 = pauVar43 + 1;
              uVar48 = uVar47;
            }
          }
          else {
            auVar66._8_8_ = 0;
            auVar66._0_8_ = uVar48;
            auVar66 = vpunpcklqdq_avx(auVar66,ZEXT416(uVar5));
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar47;
            auVar65 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar46));
            lVar25 = 0;
            for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            uVar45 = uVar45 - 1 & uVar45;
            uVar48 = (ulong)uVar45;
            auVar81._8_8_ = 0;
            auVar81._0_8_ = *(ulong *)(uVar44 + lVar25 * 8);
            auVar74 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_1360 + lVar25 * 4)));
            auVar73 = vpcmpgtd_avx(auVar65,auVar66);
            if (uVar45 == 0) {
              auVar75 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar65,auVar66,auVar75);
              auVar66 = vblendvps_avx(auVar66,auVar65,auVar75);
              auVar65 = vpcmpgtd_avx(auVar74,auVar73);
              auVar75 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar74,auVar73,auVar75);
              auVar73 = vblendvps_avx(auVar73,auVar74,auVar75);
              auVar74 = vpcmpgtd_avx(auVar73,auVar66);
              auVar75 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar73,auVar66,auVar75);
              auVar66 = vblendvps_avx(auVar66,auVar73,auVar75);
              *pauVar43 = auVar66;
              pauVar43[1] = auVar74;
              uVar48 = auVar65._0_8_;
              pauVar43 = pauVar43 + 2;
            }
            else {
              lVar25 = 0;
              for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                lVar25 = lVar25 + 1;
              }
              auVar90._8_8_ = 0;
              auVar90._0_8_ = *(ulong *)(uVar44 + lVar25 * 8);
              auVar79 = vpunpcklqdq_avx(auVar90,ZEXT416(*(uint *)(local_1360 + lVar25 * 4)));
              auVar75 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar65,auVar66,auVar75);
              auVar66 = vblendvps_avx(auVar66,auVar65,auVar75);
              auVar65 = vpcmpgtd_avx(auVar79,auVar74);
              auVar75 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar79,auVar74,auVar75);
              auVar74 = vblendvps_avx(auVar74,auVar79,auVar75);
              auVar75 = vpcmpgtd_avx(auVar74,auVar66);
              auVar79 = vpshufd_avx(auVar75,0xaa);
              auVar75 = vblendvps_avx(auVar74,auVar66,auVar79);
              auVar66 = vblendvps_avx(auVar66,auVar74,auVar79);
              auVar74 = vpcmpgtd_avx(auVar65,auVar73);
              auVar79 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar65,auVar73,auVar79);
              auVar65 = vblendvps_avx(auVar73,auVar65,auVar79);
              auVar73 = vpcmpgtd_avx(auVar75,auVar65);
              auVar79 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar75,auVar65,auVar79);
              auVar65 = vblendvps_avx(auVar65,auVar75,auVar79);
              *pauVar43 = auVar66;
              pauVar43[1] = auVar65;
              pauVar43[2] = auVar73;
              uVar48 = auVar74._0_8_;
              pauVar43 = pauVar43 + 3;
            }
          }
        }
      }
      if (((uint)uVar48 & 0xf) == 8) {
        pGVar50 = (pre->super_Precalculations).grid;
        uVar45 = *(uint *)(pGVar50 + 0xc);
        local_14b0 = (ulong)uVar45;
        uVar5 = *(uint *)(pGVar50 + 0x10);
        local_14a8 = (ulong)uVar5;
        uVar46 = *(uint *)(pGVar50 + 0x24);
        uVar48 = uVar48 >> 4;
        lVar25 = uVar48 * 4 + (ulong)uVar46;
        auVar66 = *(undefined1 (*) [16])(pGVar50 + local_14b0 * 4 + lVar25 + 0x2c);
        auVar65 = auVar66;
        if (2 < local_14a8) {
          auVar65 = *(undefined1 (*) [16])
                     (pGVar50 + local_14b0 * 8 + uVar48 * 4 + (ulong)uVar46 + 0x2c);
        }
        auVar73 = *(undefined1 (*) [16])(pGVar50 + uVar48 * 4 + (ulong)uVar46 + 0x2c);
        if (local_14b0 == 2) {
          auVar73 = vshufps_avx(auVar73,auVar73,0x54);
          auVar66 = vshufps_avx(auVar66,auVar66,0x54);
          auVar65 = vshufps_avx(auVar65,auVar65,0x54);
        }
        uVar48 = (ulong)*(uint *)(pGVar50 + 0x14);
        pGVar52 = pGVar50 + uVar48 * 4 + lVar25 + 0x2c;
        auVar74 = *(undefined1 (*) [16])(pGVar52 + local_14b0 * 4);
        auVar75 = auVar74;
        if (2 < uVar5) {
          auVar75 = *(undefined1 (*) [16])(pGVar52 + local_14b0 * 8);
        }
        auVar79 = *(undefined1 (*) [16])pGVar52;
        if (uVar45 == 2) {
          auVar79 = vshufps_avx(auVar79,auVar79,0x54);
          auVar74 = vshufps_avx(auVar74,auVar74,0x54);
          auVar75 = vshufps_avx(auVar75,auVar75,0x54);
        }
        pGVar52 = pGVar50 + uVar48 * 8 + lVar25 + 0x2c;
        auVar80 = *(undefined1 (*) [16])(pGVar52 + local_14b0 * 4);
        auVar76 = auVar80;
        if (2 < uVar5) {
          auVar76 = *(undefined1 (*) [16])(pGVar52 + local_14b0 * 8);
        }
        auVar110._16_16_ = auVar66;
        auVar110._0_16_ = auVar73;
        auVar56._16_16_ = auVar65;
        auVar56._0_16_ = auVar66;
        auVar71 = vunpcklps_avx(auVar110,auVar56);
        auVar67 = vshufps_avx(auVar110,auVar110,0xa5);
        auVar56 = vshufps_avx(auVar56,auVar56,0x94);
        auVar97._16_16_ = auVar74;
        auVar97._0_16_ = auVar79;
        auVar87._16_16_ = auVar75;
        auVar87._0_16_ = auVar74;
        auVar110 = vunpcklps_avx(auVar97,auVar87);
        auVar97 = vshufps_avx(auVar97,auVar97,0xa5);
        auVar87 = vshufps_avx(auVar87,auVar87,0x94);
        auVar66 = *(undefined1 (*) [16])pGVar52;
        if (uVar45 == 2) {
          auVar66 = vshufps_avx(auVar66,auVar66,0x54);
          auVar80 = vshufps_avx(auVar80,auVar80,0x54);
          auVar76 = vshufps_avx(auVar76,auVar76,0x54);
        }
        local_14b8 = pGVar50 + uVar48 * 0xc + lVar25 + 0x2c;
        auVar101._16_16_ = auVar80;
        auVar101._0_16_ = auVar66;
        auVar92._16_16_ = auVar76;
        auVar92._0_16_ = auVar80;
        auVar24 = vunpcklps_avx(auVar101,auVar92);
        auVar101 = vshufps_avx(auVar101,auVar101,0xa5);
        auVar70 = vshufps_avx(auVar92,auVar92,0x94);
        uVar115 = *(undefined4 *)(ray + k * 4);
        auVar121._4_4_ = uVar115;
        auVar121._0_4_ = uVar115;
        auVar121._8_4_ = uVar115;
        auVar121._12_4_ = uVar115;
        auVar121._16_4_ = uVar115;
        auVar121._20_4_ = uVar115;
        auVar121._24_4_ = uVar115;
        auVar121._28_4_ = uVar115;
        uVar115 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar123._4_4_ = uVar115;
        auVar123._0_4_ = uVar115;
        auVar123._8_4_ = uVar115;
        auVar123._12_4_ = uVar115;
        auVar123._16_4_ = uVar115;
        auVar123._20_4_ = uVar115;
        auVar123._24_4_ = uVar115;
        auVar123._28_4_ = uVar115;
        uVar116 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar124._4_4_ = uVar116;
        auVar124._0_4_ = uVar116;
        auVar124._8_4_ = uVar116;
        auVar124._12_4_ = uVar116;
        auVar124._16_4_ = uVar116;
        auVar124._20_4_ = uVar116;
        auVar124._24_4_ = uVar116;
        auVar124._28_4_ = uVar116;
        auVar71 = vsubps_avx(auVar71,auVar121);
        local_10e0 = vsubps_avx(auVar110,auVar123);
        local_1100 = vsubps_avx(auVar24,auVar124);
        auVar67 = vsubps_avx(auVar67,auVar121);
        auVar97 = vsubps_avx(auVar97,auVar123);
        auVar110 = vsubps_avx(auVar101,auVar124);
        auVar56 = vsubps_avx(auVar56,auVar121);
        auVar87 = vsubps_avx(auVar87,auVar123);
        auVar101 = vsubps_avx(auVar70,auVar124);
        local_1120 = vsubps_avx(auVar56,auVar71);
        local_1160 = vsubps_avx(auVar87,local_10e0);
        local_1140 = vsubps_avx(auVar101,local_1100);
        auVar68._0_4_ = auVar71._0_4_ + auVar56._0_4_;
        auVar68._4_4_ = auVar71._4_4_ + auVar56._4_4_;
        auVar68._8_4_ = auVar71._8_4_ + auVar56._8_4_;
        auVar68._12_4_ = auVar71._12_4_ + auVar56._12_4_;
        auVar68._16_4_ = auVar71._16_4_ + auVar56._16_4_;
        auVar68._20_4_ = auVar71._20_4_ + auVar56._20_4_;
        auVar68._24_4_ = auVar71._24_4_ + auVar56._24_4_;
        auVar68._28_4_ = auVar71._28_4_ + auVar56._28_4_;
        auVar88._0_4_ = auVar87._0_4_ + local_10e0._0_4_;
        auVar88._4_4_ = auVar87._4_4_ + local_10e0._4_4_;
        auVar88._8_4_ = auVar87._8_4_ + local_10e0._8_4_;
        auVar88._12_4_ = auVar87._12_4_ + local_10e0._12_4_;
        auVar88._16_4_ = auVar87._16_4_ + local_10e0._16_4_;
        auVar88._20_4_ = auVar87._20_4_ + local_10e0._20_4_;
        auVar88._24_4_ = auVar87._24_4_ + local_10e0._24_4_;
        fVar7 = local_10e0._28_4_;
        fVar98 = auVar87._28_4_;
        auVar88._28_4_ = fVar98 + fVar7;
        fVar125 = local_1100._0_4_;
        auVar122._0_4_ = fVar125 + auVar101._0_4_;
        fVar127 = local_1100._4_4_;
        auVar122._4_4_ = fVar127 + auVar101._4_4_;
        fVar129 = local_1100._8_4_;
        auVar122._8_4_ = fVar129 + auVar101._8_4_;
        fVar131 = local_1100._12_4_;
        auVar122._12_4_ = fVar131 + auVar101._12_4_;
        fVar133 = local_1100._16_4_;
        auVar122._16_4_ = fVar133 + auVar101._16_4_;
        fVar135 = local_1100._20_4_;
        auVar122._20_4_ = fVar135 + auVar101._20_4_;
        fVar137 = local_1100._24_4_;
        auVar122._24_4_ = fVar137 + auVar101._24_4_;
        auVar122._28_4_ = local_1100._28_4_ + auVar101._28_4_;
        auVar70._4_4_ = local_1140._4_4_ * auVar88._4_4_;
        auVar70._0_4_ = local_1140._0_4_ * auVar88._0_4_;
        auVar70._8_4_ = local_1140._8_4_ * auVar88._8_4_;
        auVar70._12_4_ = local_1140._12_4_ * auVar88._12_4_;
        auVar70._16_4_ = local_1140._16_4_ * auVar88._16_4_;
        auVar70._20_4_ = local_1140._20_4_ * auVar88._20_4_;
        auVar70._24_4_ = local_1140._24_4_ * auVar88._24_4_;
        auVar70._28_4_ = uVar116;
        auVar65 = vfmsub231ps_fma(auVar70,local_1160,auVar122);
        auVar24._4_4_ = auVar122._4_4_ * local_1120._4_4_;
        auVar24._0_4_ = auVar122._0_4_ * local_1120._0_4_;
        auVar24._8_4_ = auVar122._8_4_ * local_1120._8_4_;
        auVar24._12_4_ = auVar122._12_4_ * local_1120._12_4_;
        auVar24._16_4_ = auVar122._16_4_ * local_1120._16_4_;
        auVar24._20_4_ = auVar122._20_4_ * local_1120._20_4_;
        auVar24._24_4_ = auVar122._24_4_ * local_1120._24_4_;
        auVar24._28_4_ = uVar115;
        auVar66 = vfmsub231ps_fma(auVar24,local_1140,auVar68);
        auVar102._4_4_ = auVar68._4_4_ * local_1160._4_4_;
        auVar102._0_4_ = auVar68._0_4_ * local_1160._0_4_;
        auVar102._8_4_ = auVar68._8_4_ * local_1160._8_4_;
        auVar102._12_4_ = auVar68._12_4_ * local_1160._12_4_;
        auVar102._16_4_ = auVar68._16_4_ * local_1160._16_4_;
        auVar102._20_4_ = auVar68._20_4_ * local_1160._20_4_;
        auVar102._24_4_ = auVar68._24_4_ * local_1160._24_4_;
        auVar102._28_4_ = auVar68._28_4_;
        fVar4 = *(float *)(ray + k * 4 + 0xc0);
        auVar73 = vfmsub231ps_fma(auVar102,local_1120,auVar88);
        auVar26._4_4_ = fVar4 * auVar73._4_4_;
        auVar26._0_4_ = fVar4 * auVar73._0_4_;
        auVar26._8_4_ = fVar4 * auVar73._8_4_;
        auVar26._12_4_ = fVar4 * auVar73._12_4_;
        auVar26._16_4_ = fVar4 * 0.0;
        auVar26._20_4_ = fVar4 * 0.0;
        auVar26._24_4_ = fVar4 * 0.0;
        auVar26._28_4_ = local_1120._28_4_;
        uVar115 = *(undefined4 *)(ray + k * 4 + 0xa0);
        local_1180._4_4_ = uVar115;
        local_1180._0_4_ = uVar115;
        local_1180._8_4_ = uVar115;
        local_1180._12_4_ = uVar115;
        local_1180._16_4_ = uVar115;
        local_1180._20_4_ = uVar115;
        local_1180._24_4_ = uVar115;
        local_1180._28_4_ = uVar115;
        auVar66 = vfmadd231ps_fma(auVar26,local_1180,ZEXT1632(auVar66));
        uVar115 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar57._4_4_ = uVar115;
        auVar57._0_4_ = uVar115;
        auVar57._8_4_ = uVar115;
        auVar57._12_4_ = uVar115;
        auVar57._16_4_ = uVar115;
        auVar57._20_4_ = uVar115;
        auVar57._24_4_ = uVar115;
        auVar57._28_4_ = uVar115;
        local_1360 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar57,ZEXT1632(auVar65));
        local_11a0 = vsubps_avx(local_10e0,auVar97);
        local_11c0 = vsubps_avx(local_1100,auVar110);
        auVar77._0_4_ = auVar97._0_4_ + local_10e0._0_4_;
        auVar77._4_4_ = auVar97._4_4_ + local_10e0._4_4_;
        auVar77._8_4_ = auVar97._8_4_ + local_10e0._8_4_;
        auVar77._12_4_ = auVar97._12_4_ + local_10e0._12_4_;
        auVar77._16_4_ = auVar97._16_4_ + local_10e0._16_4_;
        auVar77._20_4_ = auVar97._20_4_ + local_10e0._20_4_;
        auVar77._24_4_ = auVar97._24_4_ + local_10e0._24_4_;
        auVar77._28_4_ = auVar97._28_4_ + fVar7;
        auVar89._0_4_ = fVar125 + auVar110._0_4_;
        auVar89._4_4_ = fVar127 + auVar110._4_4_;
        auVar89._8_4_ = fVar129 + auVar110._8_4_;
        auVar89._12_4_ = fVar131 + auVar110._12_4_;
        auVar89._16_4_ = fVar133 + auVar110._16_4_;
        auVar89._20_4_ = fVar135 + auVar110._20_4_;
        auVar89._24_4_ = fVar137 + auVar110._24_4_;
        auVar89._28_4_ = local_1100._28_4_ + auVar110._28_4_;
        fVar8 = local_11c0._0_4_;
        fVar9 = local_11c0._4_4_;
        auVar27._4_4_ = auVar77._4_4_ * fVar9;
        auVar27._0_4_ = auVar77._0_4_ * fVar8;
        fVar11 = local_11c0._8_4_;
        auVar27._8_4_ = auVar77._8_4_ * fVar11;
        fVar13 = local_11c0._12_4_;
        auVar27._12_4_ = auVar77._12_4_ * fVar13;
        fVar15 = local_11c0._16_4_;
        auVar27._16_4_ = auVar77._16_4_ * fVar15;
        fVar17 = local_11c0._20_4_;
        auVar27._20_4_ = auVar77._20_4_ * fVar17;
        fVar19 = local_11c0._24_4_;
        auVar27._24_4_ = auVar77._24_4_ * fVar19;
        auVar27._28_4_ = fVar7;
        auVar65 = vfmsub231ps_fma(auVar27,local_11a0,auVar89);
        auVar70 = vsubps_avx(auVar71,auVar67);
        fVar126 = auVar70._0_4_;
        fVar128 = auVar70._4_4_;
        auVar28._4_4_ = fVar128 * auVar89._4_4_;
        auVar28._0_4_ = fVar126 * auVar89._0_4_;
        fVar130 = auVar70._8_4_;
        auVar28._8_4_ = fVar130 * auVar89._8_4_;
        fVar132 = auVar70._12_4_;
        auVar28._12_4_ = fVar132 * auVar89._12_4_;
        fVar134 = auVar70._16_4_;
        auVar28._16_4_ = fVar134 * auVar89._16_4_;
        fVar136 = auVar70._20_4_;
        auVar28._20_4_ = fVar136 * auVar89._20_4_;
        fVar138 = auVar70._24_4_;
        auVar28._24_4_ = fVar138 * auVar89._24_4_;
        auVar28._28_4_ = auVar89._28_4_;
        auVar111._0_4_ = auVar71._0_4_ + auVar67._0_4_;
        auVar111._4_4_ = auVar71._4_4_ + auVar67._4_4_;
        auVar111._8_4_ = auVar71._8_4_ + auVar67._8_4_;
        auVar111._12_4_ = auVar71._12_4_ + auVar67._12_4_;
        auVar111._16_4_ = auVar71._16_4_ + auVar67._16_4_;
        auVar111._20_4_ = auVar71._20_4_ + auVar67._20_4_;
        auVar111._24_4_ = auVar71._24_4_ + auVar67._24_4_;
        auVar111._28_4_ = auVar71._28_4_ + auVar67._28_4_;
        auVar66 = vfmsub231ps_fma(auVar28,local_11c0,auVar111);
        fVar7 = local_11a0._0_4_;
        fVar10 = local_11a0._4_4_;
        auVar29._4_4_ = auVar111._4_4_ * fVar10;
        auVar29._0_4_ = auVar111._0_4_ * fVar7;
        fVar12 = local_11a0._8_4_;
        auVar29._8_4_ = auVar111._8_4_ * fVar12;
        fVar14 = local_11a0._12_4_;
        auVar29._12_4_ = auVar111._12_4_ * fVar14;
        fVar16 = local_11a0._16_4_;
        auVar29._16_4_ = auVar111._16_4_ * fVar16;
        fVar18 = local_11a0._20_4_;
        auVar29._20_4_ = auVar111._20_4_ * fVar18;
        fVar20 = local_11a0._24_4_;
        auVar29._24_4_ = auVar111._24_4_ * fVar20;
        auVar29._28_4_ = auVar111._28_4_;
        auVar73 = vfmsub231ps_fma(auVar29,auVar70,auVar77);
        auVar30._4_4_ = auVar73._4_4_ * fVar4;
        auVar30._0_4_ = auVar73._0_4_ * fVar4;
        auVar30._8_4_ = auVar73._8_4_ * fVar4;
        auVar30._12_4_ = auVar73._12_4_ * fVar4;
        auVar30._16_4_ = fVar4 * 0.0;
        auVar30._20_4_ = fVar4 * 0.0;
        auVar30._24_4_ = fVar4 * 0.0;
        auVar30._28_4_ = local_11c0._28_4_;
        auVar66 = vfmadd231ps_fma(auVar30,local_1180,ZEXT1632(auVar66));
        auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar57,ZEXT1632(auVar65));
        auVar24 = vsubps_avx(auVar67,auVar56);
        auVar82._0_4_ = auVar67._0_4_ + auVar56._0_4_;
        auVar82._4_4_ = auVar67._4_4_ + auVar56._4_4_;
        auVar82._8_4_ = auVar67._8_4_ + auVar56._8_4_;
        auVar82._12_4_ = auVar67._12_4_ + auVar56._12_4_;
        auVar82._16_4_ = auVar67._16_4_ + auVar56._16_4_;
        auVar82._20_4_ = auVar67._20_4_ + auVar56._20_4_;
        auVar82._24_4_ = auVar67._24_4_ + auVar56._24_4_;
        auVar82._28_4_ = auVar67._28_4_ + auVar56._28_4_;
        auVar102 = vsubps_avx(auVar97,auVar87);
        auVar58._0_4_ = auVar97._0_4_ + auVar87._0_4_;
        auVar58._4_4_ = auVar97._4_4_ + auVar87._4_4_;
        auVar58._8_4_ = auVar97._8_4_ + auVar87._8_4_;
        auVar58._12_4_ = auVar97._12_4_ + auVar87._12_4_;
        auVar58._16_4_ = auVar97._16_4_ + auVar87._16_4_;
        auVar58._20_4_ = auVar97._20_4_ + auVar87._20_4_;
        auVar58._24_4_ = auVar97._24_4_ + auVar87._24_4_;
        auVar58._28_4_ = auVar97._28_4_ + fVar98;
        auVar97 = vsubps_avx(auVar110,auVar101);
        auVar78._0_4_ = auVar110._0_4_ + auVar101._0_4_;
        auVar78._4_4_ = auVar110._4_4_ + auVar101._4_4_;
        auVar78._8_4_ = auVar110._8_4_ + auVar101._8_4_;
        auVar78._12_4_ = auVar110._12_4_ + auVar101._12_4_;
        auVar78._16_4_ = auVar110._16_4_ + auVar101._16_4_;
        auVar78._20_4_ = auVar110._20_4_ + auVar101._20_4_;
        auVar78._24_4_ = auVar110._24_4_ + auVar101._24_4_;
        auVar78._28_4_ = auVar110._28_4_ + auVar101._28_4_;
        auVar31._4_4_ = auVar97._4_4_ * auVar58._4_4_;
        auVar31._0_4_ = auVar97._0_4_ * auVar58._0_4_;
        auVar31._8_4_ = auVar97._8_4_ * auVar58._8_4_;
        auVar31._12_4_ = auVar97._12_4_ * auVar58._12_4_;
        auVar31._16_4_ = auVar97._16_4_ * auVar58._16_4_;
        auVar31._20_4_ = auVar97._20_4_ * auVar58._20_4_;
        auVar31._24_4_ = auVar97._24_4_ * auVar58._24_4_;
        auVar31._28_4_ = fVar98;
        auVar73 = vfmsub231ps_fma(auVar31,auVar102,auVar78);
        auVar32._4_4_ = auVar78._4_4_ * auVar24._4_4_;
        auVar32._0_4_ = auVar78._0_4_ * auVar24._0_4_;
        auVar32._8_4_ = auVar78._8_4_ * auVar24._8_4_;
        auVar32._12_4_ = auVar78._12_4_ * auVar24._12_4_;
        auVar32._16_4_ = auVar78._16_4_ * auVar24._16_4_;
        auVar32._20_4_ = auVar78._20_4_ * auVar24._20_4_;
        auVar32._24_4_ = auVar78._24_4_ * auVar24._24_4_;
        auVar32._28_4_ = auVar78._28_4_;
        auVar65 = vfmsub231ps_fma(auVar32,auVar97,auVar82);
        auVar33._4_4_ = auVar82._4_4_ * auVar102._4_4_;
        auVar33._0_4_ = auVar82._0_4_ * auVar102._0_4_;
        auVar33._8_4_ = auVar82._8_4_ * auVar102._8_4_;
        auVar33._12_4_ = auVar82._12_4_ * auVar102._12_4_;
        auVar33._16_4_ = auVar82._16_4_ * auVar102._16_4_;
        auVar33._20_4_ = auVar82._20_4_ * auVar102._20_4_;
        auVar33._24_4_ = auVar82._24_4_ * auVar102._24_4_;
        auVar33._28_4_ = auVar82._28_4_;
        auVar74 = vfmsub231ps_fma(auVar33,auVar24,auVar58);
        auVar83._0_4_ = fVar4 * auVar74._0_4_;
        auVar83._4_4_ = fVar4 * auVar74._4_4_;
        auVar83._8_4_ = fVar4 * auVar74._8_4_;
        auVar83._12_4_ = fVar4 * auVar74._12_4_;
        auVar83._16_4_ = fVar4 * 0.0;
        auVar83._20_4_ = fVar4 * 0.0;
        auVar83._24_4_ = fVar4 * 0.0;
        auVar83._28_4_ = 0;
        auVar65 = vfmadd231ps_fma(auVar83,local_1180,ZEXT1632(auVar65));
        auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar57,ZEXT1632(auVar73));
        auVar91._0_8_ =
             CONCAT44(auVar65._4_4_ + local_1360._4_4_ + auVar66._4_4_,
                      auVar65._0_4_ + local_1360._0_4_ + auVar66._0_4_);
        auVar91._8_4_ = auVar65._8_4_ + local_1360._8_4_ + auVar66._8_4_;
        auVar91._12_4_ = auVar65._12_4_ + local_1360._12_4_ + auVar66._12_4_;
        auVar87 = ZEXT1632(auVar91);
        auVar67 = vminps_avx(ZEXT1632(local_1360),ZEXT1632(auVar66));
        auVar67 = vminps_avx(auVar67,ZEXT1632(auVar65));
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        auVar59._16_4_ = 0x7fffffff;
        auVar59._20_4_ = 0x7fffffff;
        auVar59._24_4_ = 0x7fffffff;
        auVar59._28_4_ = 0x7fffffff;
        local_11e0 = vandps_avx(auVar87,auVar59);
        fVar98 = local_11e0._0_4_ * 1.1920929e-07;
        fVar104 = local_11e0._4_4_ * 1.1920929e-07;
        auVar34._4_4_ = fVar104;
        auVar34._0_4_ = fVar98;
        fVar105 = local_11e0._8_4_ * 1.1920929e-07;
        auVar34._8_4_ = fVar105;
        fVar106 = local_11e0._12_4_ * 1.1920929e-07;
        auVar34._12_4_ = fVar106;
        fVar107 = local_11e0._16_4_ * 1.1920929e-07;
        auVar34._16_4_ = fVar107;
        fVar108 = local_11e0._20_4_ * 1.1920929e-07;
        auVar34._20_4_ = fVar108;
        uVar5 = local_11e0._28_4_;
        fVar109 = local_11e0._24_4_ * 1.1920929e-07;
        auVar34._24_4_ = fVar109;
        auVar34._28_4_ = uVar5;
        auVar112._0_8_ = CONCAT44(fVar104,fVar98) ^ 0x8000000080000000;
        auVar112._8_4_ = -fVar105;
        auVar112._12_4_ = -fVar106;
        auVar112._16_4_ = -fVar107;
        auVar112._20_4_ = -fVar108;
        auVar112._24_4_ = -fVar109;
        auVar112._28_4_ = uVar5 ^ 0x80000000;
        auVar67 = vcmpps_avx(auVar67,auVar112,5);
        auVar56 = vmaxps_avx(ZEXT1632(local_1360),ZEXT1632(auVar66));
        auVar56 = vmaxps_avx(auVar56,ZEXT1632(auVar65));
        auVar56 = vcmpps_avx(auVar56,auVar34,2);
        auVar67 = vorps_avx(auVar67,auVar56);
        uVar45 = *(uint *)(ray + k * 4 + 0x100);
        if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar67 >> 0x7f,0) != '\0') ||
              (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar67 >> 0xbf,0) != '\0') ||
            (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar67[0x1f] < '\0') {
          auVar35._4_4_ = fVar10 * local_1140._4_4_;
          auVar35._0_4_ = fVar7 * local_1140._0_4_;
          auVar35._8_4_ = fVar12 * local_1140._8_4_;
          auVar35._12_4_ = fVar14 * local_1140._12_4_;
          auVar35._16_4_ = fVar16 * local_1140._16_4_;
          auVar35._20_4_ = fVar18 * local_1140._20_4_;
          auVar35._24_4_ = fVar20 * local_1140._24_4_;
          auVar35._28_4_ = auVar56._28_4_;
          auVar36._4_4_ = fVar128 * local_1160._4_4_;
          auVar36._0_4_ = fVar126 * local_1160._0_4_;
          auVar36._8_4_ = fVar130 * local_1160._8_4_;
          auVar36._12_4_ = fVar132 * local_1160._12_4_;
          auVar36._16_4_ = fVar134 * local_1160._16_4_;
          auVar36._20_4_ = fVar136 * local_1160._20_4_;
          auVar36._24_4_ = fVar138 * local_1160._24_4_;
          auVar36._28_4_ = uVar5;
          auVar65 = vfmsub213ps_fma(local_1160,local_11c0,auVar35);
          auStack_1470 = auVar101._16_16_;
          local_1480 = ZEXT416(uVar45);
          auVar110 = _local_1480;
          auVar113._0_4_ = fVar8 * auVar102._0_4_;
          auVar113._4_4_ = fVar9 * auVar102._4_4_;
          auVar113._8_4_ = fVar11 * auVar102._8_4_;
          auVar113._12_4_ = fVar13 * auVar102._12_4_;
          auVar113._16_4_ = fVar15 * auVar102._16_4_;
          auVar113._20_4_ = fVar17 * auVar102._20_4_;
          auVar113._24_4_ = fVar19 * auVar102._24_4_;
          auVar113._28_4_ = 0;
          auVar37._4_4_ = fVar128 * auVar97._4_4_;
          auVar37._0_4_ = fVar126 * auVar97._0_4_;
          auVar37._8_4_ = fVar130 * auVar97._8_4_;
          auVar37._12_4_ = fVar132 * auVar97._12_4_;
          auVar37._16_4_ = fVar134 * auVar97._16_4_;
          auVar37._20_4_ = fVar136 * auVar97._20_4_;
          auVar37._24_4_ = fVar138 * auVar97._24_4_;
          auVar37._28_4_ = 0x34000000;
          auVar73 = vfmsub213ps_fma(auVar97,local_11a0,auVar113);
          auVar56 = vandps_avx(auVar35,auVar59);
          auVar97 = vandps_avx(auVar113,auVar59);
          auVar56 = vcmpps_avx(auVar56,auVar97,1);
          local_1260 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar65),auVar56);
          auVar38._4_4_ = fVar10 * auVar24._4_4_;
          auVar38._0_4_ = fVar7 * auVar24._0_4_;
          auVar38._8_4_ = fVar12 * auVar24._8_4_;
          auVar38._12_4_ = fVar14 * auVar24._12_4_;
          auVar38._16_4_ = fVar16 * auVar24._16_4_;
          auVar38._20_4_ = fVar18 * auVar24._20_4_;
          auVar38._24_4_ = fVar20 * auVar24._24_4_;
          auVar38._28_4_ = auVar56._28_4_;
          auVar65 = vfmsub213ps_fma(auVar24,local_11c0,auVar37);
          auVar39._4_4_ = local_1120._4_4_ * fVar9;
          auVar39._0_4_ = local_1120._0_4_ * fVar8;
          auVar39._8_4_ = local_1120._8_4_ * fVar11;
          auVar39._12_4_ = local_1120._12_4_ * fVar13;
          auVar39._16_4_ = local_1120._16_4_ * fVar15;
          auVar39._20_4_ = local_1120._20_4_ * fVar17;
          auVar39._24_4_ = local_1120._24_4_ * fVar19;
          auVar39._28_4_ = auVar97._28_4_;
          auVar73 = vfmsub213ps_fma(local_1140,auVar70,auVar39);
          auVar56 = vandps_avx(auVar39,auVar59);
          auVar97 = vandps_avx(auVar37,auVar59);
          auVar56 = vcmpps_avx(auVar56,auVar97,1);
          local_1240 = vblendvps_avx(ZEXT1632(auVar65),ZEXT1632(auVar73),auVar56);
          auVar65 = vfmsub213ps_fma(local_1120,local_11a0,auVar36);
          auVar73 = vfmsub213ps_fma(auVar102,auVar70,auVar38);
          auVar56 = vandps_avx(auVar36,auVar59);
          auVar97 = vandps_avx(auVar38,auVar59);
          auVar56 = vcmpps_avx(auVar56,auVar97,1);
          local_1220 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar65),auVar56);
          auVar65 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
          auVar60._0_4_ = local_1220._0_4_ * fVar4;
          auVar60._4_4_ = local_1220._4_4_ * fVar4;
          auVar60._8_4_ = local_1220._8_4_ * fVar4;
          auVar60._12_4_ = local_1220._12_4_ * fVar4;
          auVar60._16_4_ = local_1220._16_4_ * fVar4;
          auVar60._20_4_ = local_1220._20_4_ * fVar4;
          auVar60._24_4_ = local_1220._24_4_ * fVar4;
          auVar60._28_4_ = 0;
          auVar73 = vfmadd213ps_fma(local_1180,local_1240,auVar60);
          auVar73 = vfmadd213ps_fma(auVar57,local_1260,ZEXT1632(auVar73));
          auVar97 = ZEXT1632(CONCAT412(auVar73._12_4_ + auVar73._12_4_,
                                       CONCAT48(auVar73._8_4_ + auVar73._8_4_,
                                                CONCAT44(auVar73._4_4_ + auVar73._4_4_,
                                                         auVar73._0_4_ + auVar73._0_4_))));
          auVar84._0_4_ = local_1220._0_4_ * fVar125;
          auVar84._4_4_ = local_1220._4_4_ * fVar127;
          auVar84._8_4_ = local_1220._8_4_ * fVar129;
          auVar84._12_4_ = local_1220._12_4_ * fVar131;
          auVar84._16_4_ = local_1220._16_4_ * fVar133;
          auVar84._20_4_ = local_1220._20_4_ * fVar135;
          auVar84._24_4_ = local_1220._24_4_ * fVar137;
          auVar84._28_4_ = 0;
          auVar73 = vfmadd213ps_fma(local_10e0,local_1240,auVar84);
          auVar74 = vfmadd213ps_fma(auVar71,local_1260,ZEXT1632(auVar73));
          auVar67 = vrcpps_avx(auVar97);
          auVar114._8_4_ = 0x3f800000;
          auVar114._0_8_ = 0x3f8000003f800000;
          auVar114._12_4_ = 0x3f800000;
          auVar114._16_4_ = 0x3f800000;
          auVar114._20_4_ = 0x3f800000;
          auVar114._24_4_ = 0x3f800000;
          auVar114._28_4_ = 0x3f800000;
          auVar73 = vfnmadd213ps_fma(auVar67,auVar97,auVar114);
          auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar67,auVar67);
          auVar100._0_8_ =
               CONCAT44((auVar74._4_4_ + auVar74._4_4_) * auVar73._4_4_,
                        (auVar74._0_4_ + auVar74._0_4_) * auVar73._0_4_);
          auVar100._8_4_ = (auVar74._8_4_ + auVar74._8_4_) * auVar73._8_4_;
          auVar100._12_4_ = (auVar74._12_4_ + auVar74._12_4_) * auVar73._12_4_;
          auVar101 = ZEXT1632(auVar100);
          uVar115 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar85._4_4_ = uVar115;
          auVar85._0_4_ = uVar115;
          auVar85._8_4_ = uVar115;
          auVar85._12_4_ = uVar115;
          auVar85._16_4_ = uVar115;
          auVar85._20_4_ = uVar115;
          auVar85._24_4_ = uVar115;
          auVar85._28_4_ = uVar115;
          auVar67 = vcmpps_avx(auVar85,auVar101,2);
          auVar93._4_4_ = uVar45;
          auVar93._0_4_ = uVar45;
          auVar93._8_4_ = uVar45;
          auVar93._12_4_ = uVar45;
          auVar93._16_4_ = uVar45;
          auVar93._20_4_ = uVar45;
          auVar93._24_4_ = uVar45;
          auVar93._28_4_ = uVar45;
          auVar56 = vcmpps_avx(auVar101,auVar93,2);
          auVar67 = vandps_avx(auVar67,auVar56);
          auVar73 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
          auVar65 = vpand_avx(auVar73,auVar65);
          auVar67 = vpmovsxwd_avx2(auVar65);
          if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar67 >> 0x7f,0) != '\0') ||
                (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar67 >> 0xbf,0) != '\0') ||
              (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar67[0x1f] < '\0') {
            auVar67 = vcmpps_avx(auVar97,_DAT_01faff00,4);
            auVar73 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
            auVar65 = vpand_avx(auVar65,auVar73);
            local_12e0 = vpmovsxwd_avx2(auVar65);
            if ((((((((local_12e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_12e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_12e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_12e0 >> 0x7f,0) != '\0') ||
                  (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_12e0 >> 0xbf,0) != '\0') ||
                (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_12e0[0x1f] < '\0') {
              local_1440._4_4_ = *(uint *)(pGVar50 + 0x18);
              local_13c0._4_4_ = *(undefined4 *)(pGVar50 + 0x1c);
              uStack_1350 = 0;
              uStack_1348 = 0;
              local_1340 = ZEXT1632(auVar66);
              uStack_1438 = auVar91._8_8_;
              local_1320 = auVar91._0_8_;
              uStack_1318 = uStack_1438;
              uStack_1310 = 0;
              uStack_1308 = 0;
              local_1300 = &local_14b8;
              uStack_14d8 = auVar100._8_8_;
              local_1280 = auVar100._0_8_;
              uStack_1278 = uStack_14d8;
              uStack_1270 = 0;
              uStack_1268 = 0;
              pGVar49 = (context->scene->geometries).items[local_1440._4_4_].ptr;
              if ((pGVar49->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                auVar65 = *(undefined1 (*) [16])(local_14b8 + local_14b0 * 4);
                auVar73 = auVar65;
                if (2 < local_14a8) {
                  auVar73 = *(undefined1 (*) [16])(local_14b8 + local_14b0 * 8);
                }
                auVar67 = vrcpps_avx(auVar87);
                auVar96._8_4_ = 0x3f800000;
                auVar96._0_8_ = 0x3f8000003f800000;
                auVar96._12_4_ = 0x3f800000;
                auVar96._16_4_ = 0x3f800000;
                auVar96._20_4_ = 0x3f800000;
                auVar96._24_4_ = 0x3f800000;
                auVar96._28_4_ = 0x3f800000;
                auVar74 = vfnmadd213ps_fma(auVar87,auVar67,auVar96);
                auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar67,auVar67);
                auVar61._8_4_ = 0x219392ef;
                auVar61._0_8_ = 0x219392ef219392ef;
                auVar61._12_4_ = 0x219392ef;
                auVar61._16_4_ = 0x219392ef;
                auVar61._20_4_ = 0x219392ef;
                auVar61._24_4_ = 0x219392ef;
                auVar61._28_4_ = 0x219392ef;
                auVar56 = vcmpps_avx(local_11e0,auVar61,5);
                auVar67 = vandps_avx(auVar56,ZEXT1632(auVar74));
                auVar40._4_4_ = auVar67._4_4_ * local_1360._4_4_;
                auVar40._0_4_ = auVar67._0_4_ * local_1360._0_4_;
                auVar40._8_4_ = auVar67._8_4_ * local_1360._8_4_;
                auVar40._12_4_ = auVar67._12_4_ * local_1360._12_4_;
                auVar40._16_4_ = auVar67._16_4_ * 0.0;
                auVar40._20_4_ = auVar67._20_4_ * 0.0;
                auVar40._24_4_ = auVar67._24_4_ * 0.0;
                auVar40._28_4_ = auVar56._28_4_;
                local_14a0 = vminps_avx(auVar40,auVar96);
                auVar69._0_4_ = auVar67._0_4_ * auVar66._0_4_;
                auVar69._4_4_ = auVar67._4_4_ * auVar66._4_4_;
                auVar69._8_4_ = auVar67._8_4_ * auVar66._8_4_;
                auVar69._12_4_ = auVar67._12_4_ * auVar66._12_4_;
                auVar69._16_4_ = auVar67._16_4_ * 0.0;
                auVar69._20_4_ = auVar67._20_4_ * 0.0;
                auVar69._24_4_ = auVar67._24_4_ * 0.0;
                auVar69._28_4_ = 0;
                auVar67 = vminps_avx(auVar69,auVar96);
                auVar66 = *(undefined1 (*) [16])local_14b8;
                if (local_14b0 == 2) {
                  auVar66 = vpshufd_avx(auVar66,0x54);
                  auVar65 = vpshufd_avx(auVar65,0x54);
                  auVar73 = vpshufd_avx(auVar73,0x54);
                }
                auVar94._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar66;
                auVar94._16_16_ = ZEXT116(1) * auVar65;
                auVar86._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar65;
                auVar86._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73;
                auVar56 = vpunpckldq_avx2(auVar94,auVar86);
                auVar87 = vpshufd_avx2(auVar94,0xa5);
                auVar24 = vpshufd_avx2(auVar86,0x94);
                auVar97 = vpsrld_avx2(auVar56,0x10);
                auVar70 = ZEXT1232(ZEXT412(0)) << 0x20;
                auVar56 = vpblendw_avx2(auVar56,auVar70,0xaa);
                auVar56 = vcvtdq2ps_avx(auVar56);
                auVar97 = vcvtdq2ps_avx(auVar97);
                auVar102 = vpsrld_avx2(auVar87,0x10);
                auVar87 = vpblendw_avx2(auVar87,auVar70,0xaa);
                auVar87 = vcvtdq2ps_avx(auVar87);
                auVar70 = vcvtdq2ps_avx(auVar102);
                auVar102 = vpsrld_avx2(auVar24,0x10);
                auVar24 = vpblendw_avx2(auVar24,ZEXT1232(ZEXT412(0)) << 0x20,0xaa);
                auVar24 = vcvtdq2ps_avx(auVar24);
                auVar102 = vcvtdq2ps_avx(auVar102);
                auVar95._0_4_ =
                     auVar102._0_4_ * 0.00012207031 * auVar67._0_4_ +
                     local_14a0._0_4_ * auVar70._0_4_ * 0.00012207031;
                auVar95._4_4_ =
                     auVar102._4_4_ * 0.00012207031 * auVar67._4_4_ +
                     local_14a0._4_4_ * auVar70._4_4_ * 0.00012207031;
                auVar95._8_4_ =
                     auVar102._8_4_ * 0.00012207031 * auVar67._8_4_ +
                     local_14a0._8_4_ * auVar70._8_4_ * 0.00012207031;
                auVar95._12_4_ =
                     auVar102._12_4_ * 0.00012207031 * auVar67._12_4_ +
                     local_14a0._12_4_ * auVar70._12_4_ * 0.00012207031;
                auVar95._16_4_ =
                     auVar102._16_4_ * 0.00012207031 * auVar67._16_4_ +
                     local_14a0._16_4_ * auVar70._16_4_ * 0.00012207031;
                auVar95._20_4_ =
                     auVar102._20_4_ * 0.00012207031 * auVar67._20_4_ +
                     local_14a0._20_4_ * auVar70._20_4_ * 0.00012207031;
                auVar95._24_4_ =
                     auVar102._24_4_ * 0.00012207031 * auVar67._24_4_ +
                     local_14a0._24_4_ * auVar70._24_4_ * 0.00012207031;
                auVar95._28_4_ = auVar87._28_4_ + auVar70._28_4_;
                auVar103._8_4_ = 0x3f800000;
                auVar103._0_8_ = 0x3f8000003f800000;
                auVar103._12_4_ = 0x3f800000;
                auVar103._16_4_ = 0x3f800000;
                auVar103._20_4_ = 0x3f800000;
                auVar103._24_4_ = 0x3f800000;
                auVar103._28_4_ = 0x3f800000;
                auVar70 = vsubps_avx(auVar103,local_14a0);
                auVar70 = vsubps_avx(auVar70,auVar67);
                local_12c0[0] =
                     auVar67._0_4_ * auVar24._0_4_ * 0.00012207031 +
                     local_14a0._0_4_ * auVar87._0_4_ * 0.00012207031 +
                     auVar70._0_4_ * auVar56._0_4_ * 0.00012207031;
                local_12c0[1] =
                     auVar67._4_4_ * auVar24._4_4_ * 0.00012207031 +
                     local_14a0._4_4_ * auVar87._4_4_ * 0.00012207031 +
                     auVar70._4_4_ * auVar56._4_4_ * 0.00012207031;
                local_12c0[2] =
                     auVar67._8_4_ * auVar24._8_4_ * 0.00012207031 +
                     local_14a0._8_4_ * auVar87._8_4_ * 0.00012207031 +
                     auVar70._8_4_ * auVar56._8_4_ * 0.00012207031;
                local_12c0[3] =
                     auVar67._12_4_ * auVar24._12_4_ * 0.00012207031 +
                     local_14a0._12_4_ * auVar87._12_4_ * 0.00012207031 +
                     auVar70._12_4_ * auVar56._12_4_ * 0.00012207031;
                fStack_12b0 = auVar67._16_4_ * auVar24._16_4_ * 0.00012207031 +
                              local_14a0._16_4_ * auVar87._16_4_ * 0.00012207031 +
                              auVar70._16_4_ * auVar56._16_4_ * 0.00012207031;
                fStack_12ac = auVar67._20_4_ * auVar24._20_4_ * 0.00012207031 +
                              local_14a0._20_4_ * auVar87._20_4_ * 0.00012207031 +
                              auVar70._20_4_ * auVar56._20_4_ * 0.00012207031;
                fStack_12a8 = auVar67._24_4_ * auVar24._24_4_ * 0.00012207031 +
                              local_14a0._24_4_ * auVar87._24_4_ * 0.00012207031 +
                              auVar70._24_4_ * auVar56._24_4_ * 0.00012207031;
                fStack_12a4 = auVar24._28_4_ + auVar87._28_4_ + auVar67._28_4_;
                local_12a0[0] = auVar95._0_4_ + auVar70._0_4_ * auVar97._0_4_ * 0.00012207031;
                local_12a0[1] = auVar95._4_4_ + auVar70._4_4_ * auVar97._4_4_ * 0.00012207031;
                local_12a0[2] = auVar95._8_4_ + auVar70._8_4_ * auVar97._8_4_ * 0.00012207031;
                local_12a0[3] = auVar95._12_4_ + auVar70._12_4_ * auVar97._12_4_ * 0.00012207031;
                fStack_1290 = auVar95._16_4_ + auVar70._16_4_ * auVar97._16_4_ * 0.00012207031;
                fStack_128c = auVar95._20_4_ + auVar70._20_4_ * auVar97._20_4_ * 0.00012207031;
                fStack_1288 = auVar95._24_4_ + auVar70._24_4_ * auVar97._24_4_ * 0.00012207031;
                fStack_1284 = auVar95._28_4_ + auVar70._28_4_;
                auVar62._8_4_ = 0x7f800000;
                auVar62._0_8_ = 0x7f8000007f800000;
                auVar62._12_4_ = 0x7f800000;
                auVar62._16_4_ = 0x7f800000;
                auVar62._20_4_ = 0x7f800000;
                auVar62._24_4_ = 0x7f800000;
                auVar62._28_4_ = 0x7f800000;
                auVar67 = vblendvps_avx(auVar62,auVar101,local_12e0);
                auVar56 = vshufps_avx(auVar67,auVar67,0xb1);
                auVar56 = vminps_avx(auVar67,auVar56);
                auVar97 = vshufpd_avx(auVar56,auVar56,5);
                auVar56 = vminps_avx(auVar56,auVar97);
                auVar97 = vpermpd_avx2(auVar56,0x4e);
                auVar56 = vminps_avx(auVar56,auVar97);
                auVar56 = vcmpps_avx(auVar67,auVar56,0);
                auVar97 = local_12e0 & auVar56;
                auVar67 = local_12e0;
                if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar97 >> 0x7f,0) != '\0') ||
                      (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0xbf,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar97[0x1f] < '\0') {
                  auVar67 = vandps_avx(auVar56,local_12e0);
                }
                auVar56 = vpcmpeqd_avx2(auVar95,auVar95);
                auVar64 = ZEXT3264(auVar56);
                uVar46 = vmovmskps_avx(auVar67);
                uVar5 = 0;
                for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x80000000) {
                  uVar5 = uVar5 + 1;
                }
                uVar48 = (ulong)uVar5;
                local_1480._4_4_ = 0;
                local_1480._8_4_ = 0;
                local_1480._12_4_ = 0;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar49->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar7 = local_12c0[uVar48];
                  fVar4 = local_12a0[uVar48];
                  uVar115 = *(undefined4 *)(local_1260 + uVar48 * 4);
                  uVar116 = *(undefined4 *)(local_1240 + uVar48 * 4);
                  uVar117 = *(undefined4 *)(local_1220 + uVar48 * 4);
                  uVar45 = *(uint *)((long)&local_1280 + uVar48 * 4);
                  *(uint *)(ray + k * 4 + 0x100) = uVar45;
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar115;
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar116;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar117;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar7;
                  *(float *)(ray + k * 4 + 0x200) = fVar4;
                  *(undefined4 *)(ray + k * 4 + 0x220) = local_13c0._4_4_;
                  *(uint *)(ray + k * 4 + 0x240) = local_1440._4_4_;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_1440._0_4_ = local_1440._4_4_;
                  uStack_1438._0_4_ = local_1440._4_4_;
                  uStack_1438._4_4_ = local_1440._4_4_;
                  uStack_1430._0_4_ = local_1440._4_4_;
                  uStack_1430._4_4_ = local_1440._4_4_;
                  uStack_1428._0_4_ = local_1440._4_4_;
                  uStack_1428._4_4_ = local_1440._4_4_;
                  local_13c0._0_4_ = local_13c0._4_4_;
                  uStack_13b8._0_4_ = local_13c0._4_4_;
                  uStack_13b8._4_4_ = local_13c0._4_4_;
                  uStack_13b0._0_4_ = local_13c0._4_4_;
                  uStack_13b0._4_4_ = local_13c0._4_4_;
                  uStack_13a8._0_4_ = local_13c0._4_4_;
                  uStack_13a8._4_4_ = local_13c0._4_4_;
                  auStack_13d8 = auVar71._8_24_;
                  local_13e0 = pGVar49;
                  uVar115 = local_1480._4_4_;
                  uVar116 = local_1480._8_4_;
                  uVar117 = local_1480._12_4_;
                  _local_1480 = auVar110;
                  local_13a0 = local_12e0;
                  while( true ) {
                    auVar67 = _local_1480;
                    local_1060 = local_12c0[uVar48];
                    local_1040 = local_12a0[uVar48];
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)((long)&local_1280 + uVar48 * 4);
                    local_10c0 = *(undefined4 *)(local_1260 + uVar48 * 4);
                    local_10a0 = *(undefined4 *)(local_1240 + uVar48 * 4);
                    local_1080 = *(undefined4 *)(local_1220 + uVar48 * 4);
                    local_1410.context = context->user;
                    uStack_10bc = local_10c0;
                    uStack_10b8 = local_10c0;
                    uStack_10b4 = local_10c0;
                    uStack_10b0 = local_10c0;
                    uStack_10ac = local_10c0;
                    uStack_10a8 = local_10c0;
                    uStack_10a4 = local_10c0;
                    uStack_109c = local_10a0;
                    uStack_1098 = local_10a0;
                    uStack_1094 = local_10a0;
                    uStack_1090 = local_10a0;
                    uStack_108c = local_10a0;
                    uStack_1088 = local_10a0;
                    uStack_1084 = local_10a0;
                    uStack_107c = local_1080;
                    uStack_1078 = local_1080;
                    uStack_1074 = local_1080;
                    uStack_1070 = local_1080;
                    uStack_106c = local_1080;
                    uStack_1068 = local_1080;
                    uStack_1064 = local_1080;
                    fStack_105c = local_1060;
                    fStack_1058 = local_1060;
                    fStack_1054 = local_1060;
                    fStack_1050 = local_1060;
                    fStack_104c = local_1060;
                    fStack_1048 = local_1060;
                    fStack_1044 = local_1060;
                    fStack_103c = local_1040;
                    fStack_1038 = local_1040;
                    fStack_1034 = local_1040;
                    fStack_1030 = local_1040;
                    fStack_102c = local_1040;
                    fStack_1028 = local_1040;
                    fStack_1024 = local_1040;
                    local_1020 = local_13c0;
                    uStack_1018 = uStack_13b8;
                    uStack_1010 = uStack_13b0;
                    uStack_1008 = uStack_13a8;
                    local_1000 = local_1440;
                    uStack_ff8 = uStack_1438;
                    uStack_ff0 = uStack_1430;
                    uStack_fe8 = uStack_1428;
                    uStack_fdc = (local_1410.context)->instID[0];
                    local_fe0 = uStack_fdc;
                    uStack_fd8 = uStack_fdc;
                    uStack_fd4 = uStack_fdc;
                    uStack_fd0 = uStack_fdc;
                    uStack_fcc = uStack_fdc;
                    uStack_fc8 = uStack_fdc;
                    uStack_fc4 = uStack_fdc;
                    uStack_fbc = (local_1410.context)->instPrimID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = uStack_fbc;
                    uStack_fac = uStack_fbc;
                    uStack_fa8 = uStack_fbc;
                    uStack_fa4 = uStack_fbc;
                    local_1380 = local_1200;
                    local_1410.valid = (int *)local_1380;
                    local_1410.geometryUserPtr = pGVar49->userPtr;
                    local_1410.hit = (RTCHitN *)&local_10c0;
                    local_1410.N = 8;
                    local_1410.ray = (RTCRayN *)ray;
                    if (pGVar49->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_1480._4_4_ = uVar115;
                      local_1480._0_4_ = uVar45;
                      local_1480._8_4_ = uVar116;
                      auStack_1470 = auVar67._16_16_;
                      local_1480._12_4_ = uVar117;
                      local_14a0._0_8_ = uVar48;
                      auVar67 = ZEXT1632(auVar64._0_16_);
                      (*pGVar49->intersectionFilterN)(&local_1410);
                      auVar67 = vpcmpeqd_avx2(auVar67,auVar67);
                      auVar64 = ZEXT3264(auVar67);
                      uVar48 = local_14a0._0_8_;
                      pGVar49 = local_13e0;
                      uVar45 = local_1480._0_4_;
                      uVar115 = local_1480._4_4_;
                      uVar116 = local_1480._8_4_;
                      uVar117 = local_1480._12_4_;
                    }
                    auVar97 = _local_1480;
                    auVar56 = vpcmpeqd_avx2(local_1380,_DAT_01faff00);
                    auVar67 = auVar64._0_32_ & ~auVar56;
                    if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar67 >> 0x7f,0) == '\0') &&
                          (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar67 >> 0xbf,0) == '\0') &&
                        (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar67[0x1f]) {
                      auVar56 = auVar56 ^ auVar64._0_32_;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar49->field_8).field_0x2 & 0x40) != 0)))) {
                        local_1480._4_4_ = uVar115;
                        local_1480._0_4_ = uVar45;
                        local_1480._8_4_ = uVar116;
                        auStack_1470 = auVar97._16_16_;
                        local_1480._12_4_ = uVar117;
                        local_14a0._0_8_ = uVar48;
                        auVar67 = ZEXT1632(auVar64._0_16_);
                        (*p_Var6)(&local_1410);
                        auVar67 = vpcmpeqd_avx2(auVar67,auVar67);
                        auVar64 = ZEXT3264(auVar67);
                        uVar48 = local_14a0._0_8_;
                        pGVar49 = local_13e0;
                        uVar45 = local_1480._0_4_;
                        uVar115 = local_1480._4_4_;
                        uVar116 = local_1480._8_4_;
                        uVar117 = local_1480._12_4_;
                      }
                      auVar97 = vpcmpeqd_avx2(local_1380,_DAT_01faff00);
                      auVar56 = auVar97 ^ auVar64._0_32_;
                      auVar67 = auVar64._0_32_ & ~auVar97;
                      if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar67 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar67 >> 0x7f,0) != '\0') ||
                            (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar67 >> 0xbf,0) != '\0') ||
                          (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar67[0x1f] < '\0') {
                        auVar71._0_4_ = auVar97._0_4_ ^ auVar64._0_4_;
                        auVar71._4_4_ = auVar97._4_4_ ^ auVar64._4_4_;
                        auVar71._8_4_ = auVar97._8_4_ ^ auVar64._8_4_;
                        auVar71._12_4_ = auVar97._12_4_ ^ auVar64._12_4_;
                        auVar71._16_4_ = auVar97._16_4_ ^ auVar64._16_4_;
                        auVar71._20_4_ = auVar97._20_4_ ^ auVar64._20_4_;
                        auVar71._24_4_ = auVar97._24_4_ ^ auVar64._24_4_;
                        auVar71._28_4_ = auVar97._28_4_ ^ auVar64._28_4_;
                        auVar67 = vmaskmovps_avx(auVar71,*(undefined1 (*) [32])local_1410.hit);
                        *(undefined1 (*) [32])(local_1410.ray + 0x180) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar71,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x20));
                        *(undefined1 (*) [32])(local_1410.ray + 0x1a0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar71,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x40));
                        *(undefined1 (*) [32])(local_1410.ray + 0x1c0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar71,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x60));
                        *(undefined1 (*) [32])(local_1410.ray + 0x1e0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar71,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x80));
                        *(undefined1 (*) [32])(local_1410.ray + 0x200) = auVar67;
                        auVar67 = vpmaskmovd_avx2(auVar71,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0xa0));
                        *(undefined1 (*) [32])(local_1410.ray + 0x220) = auVar67;
                        auVar67 = vpmaskmovd_avx2(auVar71,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0xc0));
                        *(undefined1 (*) [32])(local_1410.ray + 0x240) = auVar67;
                        auVar67 = vpmaskmovd_avx2(auVar71,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0xe0));
                        *(undefined1 (*) [32])(local_1410.ray + 0x260) = auVar67;
                        auVar67 = vpmaskmovd_avx2(auVar71,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0x100));
                        *(undefined1 (*) [32])(local_1410.ray + 0x280) = auVar67;
                      }
                    }
                    if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar56 >> 0x7f,0) == '\0') &&
                          (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar56 >> 0xbf,0) == '\0') &&
                        (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar56[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar45;
                    }
                    else {
                      uVar45 = *(uint *)(ray + k * 4 + 0x100);
                      uVar115 = 0;
                      uVar116 = 0;
                      uVar117 = 0;
                    }
                    *(undefined4 *)(local_13a0 + uVar48 * 4) = 0;
                    auVar63._4_4_ = uVar45;
                    auVar63._0_4_ = uVar45;
                    auVar63._8_4_ = uVar45;
                    auVar63._12_4_ = uVar45;
                    auVar63._16_4_ = uVar45;
                    auVar63._20_4_ = uVar45;
                    auVar63._24_4_ = uVar45;
                    auVar63._28_4_ = uVar45;
                    auVar56 = vcmpps_avx(auVar101,auVar63,2);
                    auVar67 = vandps_avx(auVar56,local_13a0);
                    local_13a0 = local_13a0 & auVar56;
                    if ((((((((local_13a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_13a0 >> 0x3f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0) &&
                            (local_13a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && SUB321(local_13a0 >> 0x7f,0) == '\0') &&
                          (local_13a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_13a0 >> 0xbf,0) == '\0') &&
                        (local_13a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_13a0[0x1f]) break;
                    auVar72._8_4_ = 0x7f800000;
                    auVar72._0_8_ = 0x7f8000007f800000;
                    auVar72._12_4_ = 0x7f800000;
                    auVar72._16_4_ = 0x7f800000;
                    auVar72._20_4_ = 0x7f800000;
                    auVar72._24_4_ = 0x7f800000;
                    auVar72._28_4_ = 0x7f800000;
                    auVar56 = vblendvps_avx(auVar72,auVar101,auVar67);
                    auVar97 = vshufps_avx(auVar56,auVar56,0xb1);
                    auVar97 = vminps_avx(auVar56,auVar97);
                    auVar87 = vshufpd_avx(auVar97,auVar97,5);
                    auVar97 = vminps_avx(auVar97,auVar87);
                    auVar87 = vpermpd_avx2(auVar97,0x4e);
                    auVar97 = vminps_avx(auVar97,auVar87);
                    auVar97 = vcmpps_avx(auVar56,auVar97,0);
                    auVar87 = auVar67 & auVar97;
                    auVar56 = auVar67;
                    if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar87 >> 0x7f,0) != '\0') ||
                          (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar87 >> 0xbf,0) != '\0') ||
                        (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar87[0x1f] < '\0') {
                      auVar56 = vandps_avx(auVar97,auVar67);
                    }
                    uVar46 = vmovmskps_avx(auVar56);
                    uVar5 = 0;
                    for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x80000000) {
                      uVar5 = uVar5 + 1;
                    }
                    uVar48 = (ulong)uVar5;
                    local_13a0 = auVar67;
                  }
                }
              }
            }
          }
        }
        auVar64 = ZEXT1664(CONCAT412(uVar45,CONCAT48(uVar45,CONCAT44(uVar45,uVar45))));
      }
      else {
        pGVar50 = (GridSOA *)(uVar48 & 0xfffffffffffffff0);
        lVar25 = *(long *)(pGVar50 + (ulong)*(uint *)(pGVar50 + 0x2c) + 0x30);
        (pre->super_Precalculations).grid = pGVar50;
        uVar115 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar64 = ZEXT1664(CONCAT412(uVar115,CONCAT48(uVar115,CONCAT44(uVar115,uVar115))));
        if (lVar25 != 0) {
          *(long *)*pauVar43 = lVar25;
          *(undefined4 *)(*pauVar43 + 8) = 0;
          pauVar43 = pauVar43 + 1;
        }
      }
    }
    if (pauVar43 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }